

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::fastunpack_32(uint32_t *in,uint32_t *out,uint32_t bit)

{
  uint32_t *puVar1;
  logic_error *this;
  
  switch(bit) {
  case 0:
    out[0x10] = 0;
    out[0x11] = 0;
    out[0x12] = 0;
    out[0x13] = 0;
    out[0x14] = 0;
    out[0x15] = 0;
    out[0x16] = 0;
    out[0x17] = 0;
    out[0x18] = 0;
    out[0x19] = 0;
    out[0x1a] = 0;
    out[0x1b] = 0;
    out[0x1c] = 0;
    out[0x1d] = 0;
    out[0x1e] = 0;
    out[0x1f] = 0;
    out[0] = 0;
    out[1] = 0;
    out[2] = 0;
    out[3] = 0;
    out[4] = 0;
    out[5] = 0;
    out[6] = 0;
    out[7] = 0;
    out[8] = 0;
    out[9] = 0;
    out[10] = 0;
    out[0xb] = 0;
    out[0xc] = 0;
    out[0xd] = 0;
    out[0xe] = 0;
    out[0xf] = 0;
    return in;
  case 1:
    puVar1 = __fastunpack1_32(in,out);
    return puVar1;
  case 2:
    puVar1 = __fastunpack2_32(in,out);
    return puVar1;
  case 3:
    puVar1 = __fastunpack3_32(in,out);
    return puVar1;
  case 4:
    puVar1 = __fastunpack4_32(in,out);
    return puVar1;
  case 5:
    puVar1 = __fastunpack5_32(in,out);
    return puVar1;
  case 6:
    puVar1 = __fastunpack6_32(in,out);
    return puVar1;
  case 7:
    puVar1 = __fastunpack7_32(in,out);
    return puVar1;
  case 8:
    puVar1 = __fastunpack8_32(in,out);
    return puVar1;
  case 9:
    puVar1 = __fastunpack9_32(in,out);
    return puVar1;
  case 10:
    puVar1 = __fastunpack10_32(in,out);
    return puVar1;
  case 0xb:
    puVar1 = __fastunpack11_32(in,out);
    return puVar1;
  case 0xc:
    puVar1 = __fastunpack12_32(in,out);
    return puVar1;
  case 0xd:
    puVar1 = __fastunpack13_32(in,out);
    return puVar1;
  case 0xe:
    puVar1 = __fastunpack14_32(in,out);
    return puVar1;
  case 0xf:
    puVar1 = __fastunpack15_32(in,out);
    return puVar1;
  case 0x10:
    puVar1 = __fastunpack16_32(in,out);
    return puVar1;
  case 0x11:
    puVar1 = __fastunpack17_32(in,out);
    return puVar1;
  case 0x12:
    puVar1 = __fastunpack18_32(in,out);
    return puVar1;
  case 0x13:
    puVar1 = __fastunpack19_32(in,out);
    return puVar1;
  case 0x14:
    puVar1 = __fastunpack20_32(in,out);
    return puVar1;
  case 0x15:
    puVar1 = __fastunpack21_32(in,out);
    return puVar1;
  case 0x16:
    puVar1 = __fastunpack22_32(in,out);
    return puVar1;
  case 0x17:
    puVar1 = __fastunpack23_32(in,out);
    return puVar1;
  case 0x18:
    puVar1 = __fastunpack24_32(in,out);
    return puVar1;
  case 0x19:
    puVar1 = __fastunpack25_32(in,out);
    return puVar1;
  case 0x1a:
    puVar1 = __fastunpack26_32(in,out);
    return puVar1;
  case 0x1b:
    puVar1 = __fastunpack27_32(in,out);
    return puVar1;
  case 0x1c:
    puVar1 = __fastunpack28_32(in,out);
    return puVar1;
  case 0x1d:
    puVar1 = __fastunpack29_32(in,out);
    return puVar1;
  case 0x1e:
    puVar1 = __fastunpack30_32(in,out);
    return puVar1;
  case 0x1f:
    puVar1 = __fastunpack31_32(in,out);
    return puVar1;
  case 0x20:
    puVar1 = __fastunpack32_32(in,out);
    return puVar1;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"number of bits is unsupported");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
}

Assistant:

const uint32_t *fastunpack_32(const uint32_t *__restrict__ in,
                              uint32_t *__restrict__ out, const uint32_t bit) {
  switch (bit) {
  case 0:
    return nullunpacker32(in, out);

  case 1:
    return __fastunpack1_32(in, out);

  case 2:
    return __fastunpack2_32(in, out);

  case 3:
    return __fastunpack3_32(in, out);

  case 4:
    return __fastunpack4_32(in, out);

  case 5:
    return __fastunpack5_32(in, out);

  case 6:
    return __fastunpack6_32(in, out);

  case 7:
    return __fastunpack7_32(in, out);

  case 8:
    return __fastunpack8_32(in, out);

  case 9:
    return __fastunpack9_32(in, out);

  case 10:
    return __fastunpack10_32(in, out);

  case 11:
    return __fastunpack11_32(in, out);

  case 12:
    return __fastunpack12_32(in, out);

  case 13:
    return __fastunpack13_32(in, out);

  case 14:
    return __fastunpack14_32(in, out);

  case 15:
    return __fastunpack15_32(in, out);

  case 16:
    return __fastunpack16_32(in, out);

  case 17:
    return __fastunpack17_32(in, out);

  case 18:
    return __fastunpack18_32(in, out);

  case 19:
    return __fastunpack19_32(in, out);

  case 20:
    return __fastunpack20_32(in, out);

  case 21:
    return __fastunpack21_32(in, out);

  case 22:
    return __fastunpack22_32(in, out);

  case 23:
    return __fastunpack23_32(in, out);

  case 24:
    return __fastunpack24_32(in, out);

  case 25:
    return __fastunpack25_32(in, out);

  case 26:
    return __fastunpack26_32(in, out);

  case 27:
    return __fastunpack27_32(in, out);

  case 28:
    return __fastunpack28_32(in, out);

  case 29:
    return __fastunpack29_32(in, out);

  case 30:
    return __fastunpack30_32(in, out);

  case 31:
    return __fastunpack31_32(in, out);

  case 32:
    return __fastunpack32_32(in, out);

  default:
    break;
  }
  throw std::logic_error("number of bits is unsupported");
}